

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyHashInit(SyHash *pHash,SyMemBackend *pAllocator,ProcHash xHash,ProcCmp xCmp)

{
  SyHashEntry_Pr **ppSVar1;
  ulong uVar2;
  
  ppSVar1 = (SyHashEntry_Pr **)SyMemBackendAlloc(pAllocator,0x80);
  if (ppSVar1 != (SyHashEntry_Pr **)0x0) {
    uVar2 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)ppSVar1 + uVar2 + 4) = 0;
      uVar2 = uVar2 + 4;
    } while (uVar2 < 0x7c);
    pHash->pAllocator = pAllocator;
    pHash->xHash = SyBinHash;
    pHash->xCmp = SyMemcmp;
    pHash->pList = (SyHashEntry_Pr *)0x0;
    pHash->pCurrent = (SyHashEntry_Pr *)0x0;
    pHash->nEntry = 0;
    pHash->apBucket = ppSVar1;
    pHash->nBucketSize = 0x10;
  }
  return (sxi32)ppSVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInit(SyHash *pHash, SyMemBackend *pAllocator, ProcHash xHash, ProcCmp xCmp)
{
	SyHashEntry_Pr **apNew;
#if defined(UNTRUST)
	if( pHash == 0 ){
		return SXERR_EMPTY;
	}
#endif
	/* Allocate a new table */
	apNew = (SyHashEntry_Pr **)SyMemBackendAlloc(&(*pAllocator), sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	if( apNew == 0 ){
		return SXERR_MEM;
	}
	SyZero((void *)apNew, sizeof(SyHashEntry_Pr *) * SXHASH_BUCKET_SIZE);
	pHash->pAllocator = &(*pAllocator);
	pHash->xHash = xHash ? xHash : SyBinHash;
	pHash->xCmp = xCmp ? xCmp : SyMemcmp;
	pHash->pCurrent = pHash->pList = 0;
	pHash->nEntry = 0;
	pHash->apBucket = apNew;
	pHash->nBucketSize = SXHASH_BUCKET_SIZE;
	return SXRET_OK;
}